

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O0

void __thiscall chrono::ChArchiveOutJSON::out(ChArchiveOutJSON *this,ChNameValue<char> *bVal)

{
  ChStreamOutAsciiFile *pCVar1;
  reference pvVar2;
  ChStreamOutAscii *pCVar3;
  char *pcVar4;
  reference pvVar5;
  ChNameValue<char> *bVal_local;
  ChArchiveOutJSON *this_local;
  
  comma_cr(this);
  indent(this);
  pvVar2 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&this->is_array);
  if ((*pvVar2 & 1U) == 0) {
    pCVar3 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pcVar4 = ChNameValue<char>::name(bVal);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,pcVar4);
    pCVar3 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar3,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar3,"\t: ");
  }
  pCVar1 = this->ostream;
  pcVar4 = ChNameValue<char>::value(bVal);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(pCVar1 + 0x2d0),(int)*pcVar4);
  pvVar5 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top(&this->nitems);
  *pvVar5 = *pvVar5 + 1;
  return;
}

Assistant:

virtual void out     (ChNameValue<char> bVal){
            comma_cr();
            indent();
            if (is_array.top()==false)
                (*ostream) << "\"" << bVal.name() << "\"" << "\t: ";
            (*ostream) << (int)bVal.value();
            ++nitems.top();
      }